

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::VertexInputTest::getGlslAttributeConditions_abi_cxx11_
          (string *__return_storage_ptr__,void *this,AttributeInfo *attributeInfo,
          deUint32 attributeIndex)

{
  int iVar1;
  bool bVar2;
  char *__s;
  ostream *poVar3;
  float *pfVar4;
  float fVar5;
  float representableDiff_1;
  float representableDiff;
  string local_530 [32];
  ostringstream local_510 [8];
  ostringstream accessStream;
  string local_398 [8];
  string accessStr;
  int local_370;
  int rowNdx;
  int columnNdx;
  deUint32 componentIndex;
  Vec4 threshold;
  deUint32 totalComponentCount;
  int vertexInputCount;
  int componentCount;
  string indexId;
  ostringstream local_318 [8];
  ostringstream attributeVar;
  ostringstream local_1a0 [8];
  ostringstream glslCode;
  deUint32 attributeIndex_local;
  AttributeInfo *attributeInfo_local;
  VertexInputTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__cxx11::ostringstream::ostringstream(local_318);
  __s = "gl_InstanceIndex";
  if (attributeInfo->inputRate == VK_VERTEX_INPUT_RATE_VERTEX) {
    __s = "gl_VertexIndex";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&componentCount,__s,(allocator<char> *)((long)&vertexInputCount + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&vertexInputCount + 3));
  iVar1 = *(int *)(s_glslTypeDescriptions + (ulong)attributeInfo->glslType * 0x18 + 8);
  threshold.m_data[3] =
       *(float *)(s_glslTypeDescriptions + (ulong)attributeInfo->glslType * 0x18 + 0xc);
  threshold.m_data[2] = (float)(iVar1 * (int)threshold.m_data[3]);
  pipeline::anon_unknown_0::VertexInputTest::getFormatThreshold
            ((VertexInputTest *)&columnNdx,attributeInfo->vkType);
  rowNdx = 0;
  poVar3 = std::operator<<((ostream *)local_318,"attr");
  std::ostream::operator<<(poVar3,attributeIndex);
  std::ostream::operator<<(local_1a0,std::fixed);
  for (local_370 = 0; local_370 < (int)threshold.m_data[3]; local_370 = local_370 + 1) {
    for (accessStr.field_2._12_4_ = 0; (int)accessStr.field_2._12_4_ < iVar1;
        accessStr.field_2._12_4_ = accessStr.field_2._12_4_ + 1) {
      std::__cxx11::string::string(local_398);
      std::__cxx11::ostringstream::ostringstream(local_510);
      std::__cxx11::ostringstream::str();
      std::operator<<((ostream *)local_510,local_530);
      std::__cxx11::string::~string(local_530);
      if (threshold.m_data[3] == 1.4013e-45) {
        if (1 < iVar1) {
          poVar3 = std::operator<<((ostream *)local_510,"[");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,accessStr.field_2._12_4_);
          std::operator<<(poVar3,"]");
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)local_510,"[");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_370);
        poVar3 = std::operator<<(poVar3,"][");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,accessStr.field_2._12_4_);
        std::operator<<(poVar3,"]");
      }
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_398,(string *)&representableDiff_1);
      std::__cxx11::string::~string((string *)&representableDiff_1);
      std::__cxx11::ostringstream::~ostringstream(local_510);
      bVar2 = isVertexFormatSint(attributeInfo->vkType);
      if (bVar2) {
        poVar3 = std::operator<<((ostream *)local_1a0,"\tif (");
        poVar3 = std::operator<<(poVar3,local_398);
        poVar3 = std::operator<<(poVar3," == -(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)threshold.m_data[2]);
        poVar3 = std::operator<<(poVar3," * ");
        poVar3 = std::operator<<(poVar3,(string *)&componentCount);
        poVar3 = std::operator<<(poVar3," + ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,rowNdx);
        std::operator<<(poVar3,"))\n");
      }
      else {
        bVar2 = isVertexFormatUint(attributeInfo->vkType);
        if (bVar2) {
          poVar3 = std::operator<<((ostream *)local_1a0,"\tif (");
          poVar3 = std::operator<<(poVar3,local_398);
          poVar3 = std::operator<<(poVar3," == uint(");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)threshold.m_data[2]);
          poVar3 = std::operator<<(poVar3," * ");
          poVar3 = std::operator<<(poVar3,(string *)&componentCount);
          poVar3 = std::operator<<(poVar3," + ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,rowNdx);
          std::operator<<(poVar3,"))\n");
        }
        else {
          bVar2 = isVertexFormatSfloat(attributeInfo->vkType);
          if (bVar2) {
            if (*(int *)(s_glslTypeDescriptions + (ulong)attributeInfo->glslType * 0x18 + 0x10) == 3
               ) {
              poVar3 = std::operator<<((ostream *)local_1a0,"\tif (abs(");
              poVar3 = std::operator<<(poVar3,local_398);
              poVar3 = std::operator<<(poVar3," + double(0.01 * (");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)threshold.m_data[2]);
              poVar3 = std::operator<<(poVar3,".0 * float(");
              poVar3 = std::operator<<(poVar3,(string *)&componentCount);
              poVar3 = std::operator<<(poVar3,") + ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,rowNdx);
              poVar3 = std::operator<<(poVar3,".0))) < double(");
              pfVar4 = tcu::Vector<float,_4>::operator[]
                                 ((Vector<float,_4> *)&columnNdx,accessStr.field_2._12_4_);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar4);
              std::operator<<(poVar3,"))\n");
            }
            else {
              poVar3 = std::operator<<((ostream *)local_1a0,"\tif (abs(");
              poVar3 = std::operator<<(poVar3,local_398);
              poVar3 = std::operator<<(poVar3," + (0.01 * (");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)threshold.m_data[2]);
              poVar3 = std::operator<<(poVar3,".0 * float(");
              poVar3 = std::operator<<(poVar3,(string *)&componentCount);
              poVar3 = std::operator<<(poVar3,") + ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,rowNdx);
              poVar3 = std::operator<<(poVar3,".0))) < ");
              pfVar4 = tcu::Vector<float,_4>::operator[]
                                 ((Vector<float,_4> *)&columnNdx,accessStr.field_2._12_4_);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar4);
              std::operator<<(poVar3,")\n");
            }
          }
          else {
            bVar2 = isVertexFormatSscaled(attributeInfo->vkType);
            if (bVar2) {
              poVar3 = std::operator<<((ostream *)local_1a0,"\tif (abs(");
              poVar3 = std::operator<<(poVar3,local_398);
              poVar3 = std::operator<<(poVar3," + (");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)threshold.m_data[2]);
              poVar3 = std::operator<<(poVar3,".0 * float(");
              poVar3 = std::operator<<(poVar3,(string *)&componentCount);
              poVar3 = std::operator<<(poVar3,") + ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,rowNdx);
              poVar3 = std::operator<<(poVar3,".0)) < ");
              pfVar4 = tcu::Vector<float,_4>::operator[]
                                 ((Vector<float,_4> *)&columnNdx,accessStr.field_2._12_4_);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar4);
              std::operator<<(poVar3,")\n");
            }
            else {
              bVar2 = isVertexFormatUscaled(attributeInfo->vkType);
              if (bVar2) {
                poVar3 = std::operator<<((ostream *)local_1a0,"\t if (abs(");
                poVar3 = std::operator<<(poVar3,local_398);
                poVar3 = std::operator<<(poVar3," - (");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)threshold.m_data[2]);
                poVar3 = std::operator<<(poVar3,".0 * float(");
                poVar3 = std::operator<<(poVar3,(string *)&componentCount);
                poVar3 = std::operator<<(poVar3,") + ");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,rowNdx);
                poVar3 = std::operator<<(poVar3,".0)) < ");
                pfVar4 = tcu::Vector<float,_4>::operator[]
                                   ((Vector<float,_4> *)&columnNdx,accessStr.field_2._12_4_);
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar4);
                std::operator<<(poVar3,")\n");
              }
              else {
                bVar2 = isVertexFormatSnorm(attributeInfo->vkType);
                if (bVar2) {
                  fVar5 = pipeline::anon_unknown_0::getRepresentableDifferenceSnorm
                                    (attributeInfo->vkType);
                  poVar3 = std::operator<<((ostream *)local_1a0,"\tif (abs(");
                  poVar3 = std::operator<<(poVar3,local_398);
                  poVar3 = std::operator<<(poVar3," - (-1.0 + ");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
                  poVar3 = std::operator<<(poVar3," * (");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)threshold.m_data[2]);
                  poVar3 = std::operator<<(poVar3,".0 * float(");
                  poVar3 = std::operator<<(poVar3,(string *)&componentCount);
                  poVar3 = std::operator<<(poVar3,") + ");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rowNdx);
                  poVar3 = std::operator<<(poVar3,".0))) < ");
                  pfVar4 = tcu::Vector<float,_4>::operator[]
                                     ((Vector<float,_4> *)&columnNdx,accessStr.field_2._12_4_);
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar4);
                  std::operator<<(poVar3,")\n");
                }
                else {
                  bVar2 = isVertexFormatUnorm(attributeInfo->vkType);
                  if ((bVar2) || (bVar2 = isVertexFormatSRGB(attributeInfo->vkType), bVar2)) {
                    fVar5 = pipeline::anon_unknown_0::getRepresentableDifferenceUnorm
                                      (attributeInfo->vkType);
                    poVar3 = std::operator<<((ostream *)local_1a0,"\tif (abs(");
                    poVar3 = std::operator<<(poVar3,local_398);
                    poVar3 = std::operator<<(poVar3," - ");
                    poVar3 = std::operator<<(poVar3,"(");
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
                    poVar3 = std::operator<<(poVar3," * (");
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)threshold.m_data[2]);
                    poVar3 = std::operator<<(poVar3,".0 * float(");
                    poVar3 = std::operator<<(poVar3,(string *)&componentCount);
                    poVar3 = std::operator<<(poVar3,") + ");
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,rowNdx);
                    poVar3 = std::operator<<(poVar3,".0))) < ");
                    pfVar4 = tcu::Vector<float,_4>::operator[]
                                       ((Vector<float,_4> *)&columnNdx,accessStr.field_2._12_4_);
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar4);
                    std::operator<<(poVar3,")\n");
                  }
                }
              }
            }
          }
        }
      }
      std::operator<<((ostream *)local_1a0,"\t\tokCount++;\n\n");
      rowNdx = rowNdx + 1;
      std::__cxx11::string::~string(local_398);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string((string *)&componentCount);
  std::__cxx11::ostringstream::~ostringstream(local_318);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string VertexInputTest::getGlslAttributeConditions (const AttributeInfo& attributeInfo, deUint32 attributeIndex) const
{
	std::ostringstream	glslCode;
	std::ostringstream	attributeVar;
	const std::string	indexId				= (attributeInfo.inputRate == VK_VERTEX_INPUT_RATE_VERTEX) ? "gl_VertexIndex" : "gl_InstanceIndex";
	const int			componentCount		= VertexInputTest::s_glslTypeDescriptions[attributeInfo.glslType].vertexInputComponentCount;
	const int			vertexInputCount	= VertexInputTest::s_glslTypeDescriptions[attributeInfo.glslType].vertexInputCount;
	const deUint32		totalComponentCount	= componentCount * vertexInputCount;
	const tcu::Vec4		threshold			= getFormatThreshold(attributeInfo.vkType);
	deUint32			componentIndex		= 0;

	attributeVar << "attr" << attributeIndex;

	glslCode << std::fixed;

	for (int columnNdx = 0; columnNdx< vertexInputCount; columnNdx++)
	{
		for (int rowNdx = 0; rowNdx < componentCount; rowNdx++)
		{
			std::string accessStr;
			{
				// Build string representing the access to the attribute component
				std::ostringstream accessStream;
				accessStream << attributeVar.str();

				if (vertexInputCount == 1)
				{
					if (componentCount > 1)
						accessStream << "[" << rowNdx << "]";
				}
				else
				{
					accessStream << "[" << columnNdx << "][" << rowNdx << "]";
				}

				accessStr = accessStream.str();
			}

			if (isVertexFormatSint(attributeInfo.vkType))
			{
				glslCode << "\tif (" << accessStr << " == -(" << totalComponentCount << " * " << indexId << " + " << componentIndex << "))\n";
			}
			else if (isVertexFormatUint(attributeInfo.vkType))
			{
				glslCode << "\tif (" << accessStr << " == uint(" << totalComponentCount << " * " << indexId << " + " << componentIndex << "))\n";
			}
			else if (isVertexFormatSfloat(attributeInfo.vkType))
			{
				if (VertexInputTest::s_glslTypeDescriptions[attributeInfo.glslType].basicType == VertexInputTest::GLSL_BASIC_TYPE_DOUBLE)
				{
					glslCode << "\tif (abs(" << accessStr << " + double(0.01 * (" << totalComponentCount << ".0 * float(" << indexId << ") + " << componentIndex << ".0))) < double(" << threshold[rowNdx] << "))\n";
				}
				else
				{
					glslCode << "\tif (abs(" << accessStr << " + (0.01 * (" << totalComponentCount << ".0 * float(" << indexId << ") + " << componentIndex << ".0))) < " << threshold[rowNdx] << ")\n";
				}
			}
			else if (isVertexFormatSscaled(attributeInfo.vkType))
			{
				glslCode << "\tif (abs(" << accessStr << " + (" << totalComponentCount << ".0 * float(" << indexId << ") + " << componentIndex << ".0)) < " << threshold[rowNdx] << ")\n";
			}
			else if (isVertexFormatUscaled(attributeInfo.vkType))
			{
				glslCode << "\t if (abs(" << accessStr << " - (" << totalComponentCount << ".0 * float(" << indexId << ") + " << componentIndex << ".0)) < " << threshold[rowNdx] << ")\n";
			}
			else if (isVertexFormatSnorm(attributeInfo.vkType))
			{
				const float representableDiff = getRepresentableDifferenceSnorm(attributeInfo.vkType);

				glslCode << "\tif (abs(" << accessStr << " - (-1.0 + " << representableDiff << " * (" << totalComponentCount << ".0 * float(" << indexId << ") + " << componentIndex << ".0))) < " << threshold[rowNdx] << ")\n";
			}
			else if (isVertexFormatUnorm(attributeInfo.vkType) || isVertexFormatSRGB(attributeInfo.vkType))
			{
				const float representableDiff = getRepresentableDifferenceUnorm(attributeInfo.vkType);

				glslCode << "\tif (abs(" << accessStr << " - " << "(" << representableDiff << " * (" << totalComponentCount << ".0 * float(" << indexId << ") + " << componentIndex << ".0))) < " << threshold[rowNdx] << ")\n";
			}
			else
			{
				DE_ASSERT(false);
			}

			glslCode << "\t\tokCount++;\n\n";

			componentIndex++;
		}
	}
	return glslCode.str();
}